

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

bool leveldb::Version::Get(leveldb::ReadOptions_const&,leveldb::LookupKey_const&,std::__cxx11::
     string*,leveldb::Version::GetStats*)::State::Match(void*,int,leveldb::FileMetaData__
               (void *arg,int level,FileMetaData *f)

{
  long *plVar1;
  Env *pEVar2;
  char *pcVar3;
  char *local_28;
  _Alloc_hider local_20;
  Status local_18;
  
  plVar1 = *(long **)((long)arg + 0x28);
  if ((*plVar1 == 0) && (*(long *)((long)arg + 0x48) != 0)) {
    *plVar1 = *(long *)((long)arg + 0x48);
    *(undefined4 *)(plVar1 + 1) = *(undefined4 *)((long)arg + 0x50);
  }
  *(FileMetaData **)((long)arg + 0x48) = f;
  *(int *)((long)arg + 0x50) = level;
  TableCache::Get((TableCache *)&stack0xffffffffffffffd8,
                  *(ReadOptions **)(*(long *)((long)arg + 0x58) + 0x30),
                  *(uint64_t *)((long)arg + 0x30),f->number,(Slice *)f->file_size,
                  (void *)((long)arg + 0x38),(_func_void_void_ptr_Slice_ptr_Slice_ptr *)arg);
  pEVar2 = *(Env **)((long)arg + 0x60);
  *(char **)((long)arg + 0x60) = local_28;
  if (pEVar2 != (Env *)0x0) {
    local_28 = (char *)pEVar2;
    operator_delete__(pEVar2);
    local_28 = *(char **)((long)arg + 0x60);
  }
  if ((Env *)local_28 == (Env *)0x0) {
    switch(*arg) {
    case 0:
      return true;
    case 1:
      break;
    default:
      goto LAB_001175a2;
    case 3:
      local_28 = "corrupted key for ";
      local_20._M_p = (pointer)0x12;
      Status::Status(&stack0xffffffffffffffe8,kCorruption,(Slice *)&stack0xffffffffffffffd8,
                     (Slice *)((long)arg + 0x10));
      pcVar3 = *(char **)((long)arg + 0x60);
      *(char **)((long)arg + 0x60) = local_18.state_;
      if (pcVar3 != (char *)0x0) {
        local_18.state_ = pcVar3;
        operator_delete__(pcVar3);
      }
    }
  }
  *(undefined1 *)((long)arg + 0x68) = 1;
LAB_001175a2:
  return false;
}

Assistant:

static bool Match(void* arg, int level, FileMetaData* f) {
      State* state = reinterpret_cast<State*>(arg);

      if (state->stats->seek_file == nullptr &&
          state->last_file_read != nullptr) {
        // We have had more than one seek for this read.  Charge the 1st file.
        state->stats->seek_file = state->last_file_read;
        state->stats->seek_file_level = state->last_file_read_level;
      }

      state->last_file_read = f;
      state->last_file_read_level = level;

      state->s = state->vset->table_cache_->Get(*state->options, f->number,
                                                f->file_size, state->ikey,
                                                &state->saver, SaveValue);
      if (!state->s.ok()) {
        state->found = true;
        return false;
      }
      switch (state->saver.state) {
        case kNotFound:
          return true;  // Keep searching in other files
        case kFound:
          state->found = true;
          return false;
        case kDeleted:
          return false;
        case kCorrupt:
          state->s =
              Status::Corruption("corrupted key for ", state->saver.user_key);
          state->found = true;
          return false;
      }

      // Not reached. Added to avoid false compilation warnings of
      // "control reaches end of non-void function".
      return false;
    }